

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

Prologue * __thiscall LinkedObjectFile::print_disassembly_abi_cxx11_(LinkedObjectFile *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Config *pCVar4;
  reference pvVar5;
  ulong uVar6;
  size_type sVar7;
  reference this_00;
  long in_RSI;
  Prologue *in_RDI;
  value_type *word_1;
  int label_id_1;
  int j_1;
  size_t i_1;
  value_type *word;
  string line;
  value_type *instr;
  int j;
  int label_id;
  int i;
  bool in_delay_slot;
  Function *func;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int seg;
  bool write_hex;
  string *result;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  reference in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  ulong in_stack_fffffffffffffd00;
  LinkedObjectFile *in_stack_fffffffffffffd08;
  reference in_stack_fffffffffffffd10;
  reference in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  string local_288 [32];
  string local_268 [8];
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  LinkedObjectFile *in_stack_fffffffffffffda8;
  string local_248 [24];
  LinkedWord *in_stack_fffffffffffffdd0;
  reference in_stack_fffffffffffffdd8;
  LinkedObjectFile *in_stack_fffffffffffffde0;
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  int local_1a0;
  int local_19c;
  ulong local_198;
  string local_190 [32];
  reference local_170;
  string local_168 [24];
  LinkedObjectFile *in_stack_fffffffffffffeb0;
  Instruction *in_stack_fffffffffffffeb8;
  string local_120 [36];
  int local_fc;
  string local_f8 [36];
  int local_d4;
  int local_d0;
  byte local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  reference local_48;
  Function *local_40;
  __normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_> local_38;
  reference local_30;
  int local_18;
  undefined1 local_12;
  byte local_11;
  long lVar8;
  Prologue *this_01;
  
  lVar8 = in_RSI;
  this_01 = in_RDI;
  pCVar4 = get_config();
  local_11 = pCVar4->write_hex_near_instructions & 1;
  local_12 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  if (3 < *(int *)(in_RSI + 0x58)) {
    __assert_fail("segments <= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x1fe,"std::string LinkedObjectFile::print_disassembly()");
  }
  local_18 = *(int *)(in_RSI + 0x58);
  do {
    if (local_18 < 1) {
      return in_RDI;
    }
    local_18 = local_18 + -1;
    std::__cxx11::string::operator+=
              ((string *)in_RDI,";------------------------------------------\n;  ");
    std::__cxx11::string::operator+=((string *)in_RDI,segment_names[local_18]);
    std::__cxx11::string::operator+=
              ((string *)in_RDI,"\n;------------------------------------------\n\n");
    local_30 = std::
               vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
               ::at((vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                     *)in_stack_fffffffffffffcf0,
                    CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    local_38._M_current =
         (Function *)
         std::vector<Function,_std::allocator<Function>_>::begin
                   ((vector<Function,_std::allocator<Function>_> *)
                    CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    local_40 = (Function *)
               std::vector<Function,_std::allocator<Function>_>::end
                         ((vector<Function,_std::allocator<Function>_> *)
                          CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>
                               *)in_stack_fffffffffffffcf0,
                              (__normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>
                               *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8)),
          bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>::
                 operator*(&local_38);
      std::__cxx11::string::operator+=
                ((string *)in_RDI,";;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;\n"
                );
      std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                     (char *)in_stack_fffffffffffffcf0);
      std::__cxx11::string::operator+=((string *)in_RDI,local_68);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::operator+=
                ((string *)in_RDI,";;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;\n"
                );
      Function::Prologue::to_string_abi_cxx11_(this_01,(int)((ulong)lVar8 >> 0x20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                     (char *)in_stack_fffffffffffffcf0);
      std::__cxx11::string::operator+=((string *)in_RDI,local_a8);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_c8);
      local_c9 = 0;
      for (local_d0 = 1; local_d0 < local_48->end_word - local_48->start_word;
          local_d0 = local_d0 + 1) {
        local_d4 = get_label_at(in_stack_fffffffffffffd08,(int)(in_stack_fffffffffffffd00 >> 0x20),
                                (int)in_stack_fffffffffffffd00);
        if (local_d4 != -1) {
          std::vector<Label,_std::allocator<Label>_>::at
                    ((vector<Label,_std::allocator<Label>_> *)in_stack_fffffffffffffcf0,
                     CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
          std::__cxx11::string::operator+=((string *)in_RDI,local_f8);
          std::__cxx11::string::~string(local_f8);
        }
        for (local_fc = 1; local_fc < 4; local_fc = local_fc + 1) {
          iVar3 = get_label_at(in_stack_fffffffffffffd08,(int)(in_stack_fffffffffffffd00 >> 0x20),
                               (int)in_stack_fffffffffffffd00);
          if (iVar3 != -1) {
            std::__cxx11::string::operator+=((string *)in_RDI,"BAD OFFSET LABEL: ");
            get_label_at(in_stack_fffffffffffffd08,(int)(in_stack_fffffffffffffd00 >> 0x20),
                         (int)in_stack_fffffffffffffd00);
            std::vector<Label,_std::allocator<Label>_>::at
                      ((vector<Label,_std::allocator<Label>_> *)in_stack_fffffffffffffcf0,
                       CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
            std::__cxx11::string::operator+=((string *)in_RDI,local_120);
            std::__cxx11::string::~string(local_120);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                          ,0x21a,"std::string LinkedObjectFile::print_disassembly()");
          }
        }
        pvVar5 = std::vector<Instruction,_std::allocator<Instruction>_>::at
                           ((vector<Instruction,_std::allocator<Instruction>_> *)
                            in_stack_fffffffffffffcf0,
                            CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
        Instruction::to_string_abi_cxx11_(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        std::operator+((char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                       &in_stack_fffffffffffffcf0->name);
        std::__cxx11::string::~string(local_168);
        if ((local_11 & 1) == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
          std::__cxx11::string::operator+=((string *)in_RDI,local_190);
          std::__cxx11::string::~string(local_190);
        }
        else {
          uVar6 = std::__cxx11::string::length();
          if (uVar6 < 0x3c) {
            cVar2 = std::__cxx11::string::length();
            std::__cxx11::string::append((ulong)&stack0xfffffffffffffeb8,'<' - cVar2);
          }
          std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xfffffffffffffeb8);
          std::__cxx11::string::operator+=((string *)in_RDI," ;;");
          std::
          vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
          ::operator[]((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                        *)(in_RSI + 0x60),(long)local_18);
          in_stack_fffffffffffffd18 =
               std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                         ((vector<LinkedWord,_std::allocator<LinkedWord>_> *)
                          in_stack_fffffffffffffcf0,
                          CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
          local_170 = in_stack_fffffffffffffd18;
          append_word_to_string
                    (in_stack_fffffffffffffde0,(string *)in_stack_fffffffffffffdd8,
                     in_stack_fffffffffffffdd0);
        }
        if ((local_c9 & 1) != 0) {
          std::__cxx11::string::operator+=((string *)in_RDI,"\n");
          local_c9 = 0;
        }
        if ((gOpcodeInfo[(int)pvVar5->kind].has_delay_slot & 1U) != 0) {
          local_c9 = 1;
        }
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
      }
      std::__cxx11::string::operator+=((string *)in_RDI,"\n");
      __gnu_cxx::__normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>::
      operator++(&local_38);
    }
    in_stack_fffffffffffffd10 =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcf0
                    ,CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    local_198 = (ulong)*in_stack_fffffffffffffd10;
    while( true ) {
      in_stack_fffffffffffffd00 = local_198;
      in_stack_fffffffffffffd08 =
           (LinkedObjectFile *)
           std::
           vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 *)in_stack_fffffffffffffcf0,
                CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
      sVar7 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::size
                        ((vector<LinkedWord,_std::allocator<LinkedWord>_> *)
                         in_stack_fffffffffffffd08);
      if (sVar7 <= in_stack_fffffffffffffd00) break;
      for (local_19c = 0; local_19c < 4; local_19c = local_19c + 1) {
        in_stack_fffffffffffffcfc =
             get_label_at(in_stack_fffffffffffffd08,(int)(in_stack_fffffffffffffd00 >> 0x20),
                          (int)in_stack_fffffffffffffd00);
        local_1a0 = in_stack_fffffffffffffcfc;
        if (in_stack_fffffffffffffcfc != -1) {
          in_stack_fffffffffffffcf0 =
               std::vector<Label,_std::allocator<Label>_>::at
                         ((vector<Label,_std::allocator<Label>_> *)in_stack_fffffffffffffcf0,
                          CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
          std::__cxx11::string::operator+=((string *)in_RDI,local_1c0);
          std::__cxx11::string::~string(local_1c0);
          if (local_19c != 0) {
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
            std::operator+((char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                           &in_stack_fffffffffffffcf0->name);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                           (char *)in_stack_fffffffffffffcf0);
            std::__cxx11::string::operator+=((string *)in_RDI,local_1e0);
            std::__cxx11::string::~string(local_1e0);
            std::__cxx11::string::~string(local_200);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffde0);
          }
          std::__cxx11::string::operator+=((string *)in_RDI,"\n");
        }
      }
      this_00 = std::
                vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                ::operator[]((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                              *)(in_RSI + 0x60),(long)local_18);
      in_stack_fffffffffffffdd8 =
           std::vector<LinkedWord,_std::allocator<LinkedWord>_>::operator[](this_00,local_198);
      append_word_to_string
                (in_stack_fffffffffffffde0,(string *)in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffdd0);
      if ((in_stack_fffffffffffffdd8->kind == TYPE_PTR) &&
         (in_stack_fffffffffffffcef =
               std::operator==(&in_stack_fffffffffffffcf0->name,
                               (char *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8)
                              ), (bool)in_stack_fffffffffffffcef)) {
        get_goal_string_abi_cxx11_
                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0);
        std::operator+((char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                       &in_stack_fffffffffffffcf0->name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                       (char *)in_stack_fffffffffffffcf0);
        std::__cxx11::string::operator+=((string *)in_RDI,local_248);
        std::__cxx11::string::~string(local_248);
        std::__cxx11::string::~string(local_268);
        std::__cxx11::string::~string(local_288);
      }
      local_198 = local_198 + 1;
    }
  } while( true );
}

Assistant:

std::string LinkedObjectFile::print_disassembly() {
  bool write_hex = get_config().write_hex_near_instructions;
  std::string result;

  assert(segments <= 3);
  for (int seg = segments; seg-- > 0;) {
    // segment header
    result += ";------------------------------------------\n;  ";
    result += segment_names[seg];
    result += "\n;------------------------------------------\n\n";

    // functions
    for (auto& func : functions_by_seg.at(seg)) {
      result += ";;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;\n";
      result += "; .function " + func.guessed_name + "\n";
      result += ";;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;\n";
      result += func.prologue.to_string(2) + "\n";

      // print each instruction in the function.
      bool in_delay_slot = false;

      for (int i = 1; i < func.end_word - func.start_word; i++) {
        auto label_id = get_label_at(seg, (func.start_word + i) * 4);
        if (label_id != -1) {
          result += labels.at(label_id).name + ":\n";
        }

        for (int j = 1; j < 4; j++) {
          //          assert(get_label_at(seg, (func.start_word + i)*4 + j) == -1);
          if (get_label_at(seg, (func.start_word + i) * 4 + j) != -1) {
            result += "BAD OFFSET LABEL: ";
            result += labels.at(get_label_at(seg, (func.start_word + i) * 4 + j)).name + "\n";
            assert(false);
          }
        }

        auto& instr = func.instructions.at(i);
        std::string line = "    " + instr.to_string(*this);

        if (write_hex) {
          if (line.length() < 60) {
            line.append(60 - line.length(), ' ');
          }
          result += line;
          result += " ;;";
          auto& word = words_by_seg[seg].at(func.start_word + i);
          append_word_to_string(result, word);
        } else {
          result += line + "\n";
        }

        if (in_delay_slot) {
          result += "\n";
          in_delay_slot = false;
        }

        if (gOpcodeInfo[(int)instr.kind].has_delay_slot) {
          in_delay_slot = true;
        }
      }
      result += "\n";
      //
      //      int bid = 0;
      //      for(auto& bblock : func.basic_blocks) {
      //        result += "BLOCK " + std::to_string(bid++)+ "\n";
      //        for(int i = bblock.start_word; i < bblock.end_word; i++) {
      //          if(i >= 0 && i < func.instructions.size()) {
      //            result += func.instructions.at(i).to_string(*this) + "\n";
      //          } else {
      //            result += "BAD BBLOCK INSTR ID " + std::to_string(i);
      //          }
      //        }
      //      }
    }

    // print data
    for (size_t i = offset_of_data_zone_by_seg.at(seg); i < words_by_seg.at(seg).size(); i++) {
      for (int j = 0; j < 4; j++) {
        auto label_id = get_label_at(seg, i * 4 + j);
        if (label_id != -1) {
          result += labels.at(label_id).name + ":";
          if (j != 0) {
            result += " (offset " + std::to_string(j) + ")";
          }
          result += "\n";
        }
      }

      auto& word = words_by_seg[seg][i];
      append_word_to_string(result, word);

      if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "string") {
        result += "; " + get_goal_string(seg, i) + "\n";
      }
    }
  }

  return result;
}